

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

int erkStep_Init(void *arkode_mem,int init_type)

{
  ARKodeButcherTable pAVar1;
  ARKodeHAdaptMem pAVar2;
  int iVar3;
  N_Vector *pp_Var4;
  realtype *prVar5;
  size_t __nmemb;
  char *msgfmt;
  long lVar6;
  long lVar7;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeERKStepMem local_40;
  ARKodeMem local_38;
  
  iVar3 = erkStep_AccessStepMem(arkode_mem,"erkStep_Init",&local_38,&local_40);
  if (iVar3 != 0) {
    return iVar3;
  }
  if (init_type - 1U < 2) {
    return 0;
  }
  if ((local_38->fixedstep != 0) && (local_38->user_efun == 0)) {
    local_38->efun = arkEwtSetSmallReal;
    local_38->e_data = local_38;
  }
  iVar3 = erkStep_SetButcherTable(local_38);
  if (iVar3 == 0) {
    iVar3 = erkStep_CheckButcherTable(local_38);
    if (iVar3 == 0) {
      pAVar1 = local_40->B;
      iVar3 = pAVar1->q;
      pAVar2 = local_38->hadapt_mem;
      pAVar2->q = iVar3;
      local_40->q = iVar3;
      iVar3 = pAVar1->p;
      pAVar2->p = iVar3;
      local_40->p = iVar3;
      if (iVar3 == 0 && local_38->fixedstep == 0) {
        msgfmt = "Adaptive timestepping cannot be performed without embedding coefficients";
      }
      else {
        iVar3 = local_40->stages;
        __nmemb = (size_t)iVar3;
        if (local_40->F == (N_Vector *)0x0) {
          pp_Var4 = (N_Vector *)calloc(__nmemb,8);
          local_40->F = pp_Var4;
        }
        if (0 < iVar3) {
          lVar6 = 0;
          lVar7 = 0;
          do {
            iVar3 = arkAllocVec(local_38,local_38->ewt,(N_Vector *)((long)local_40->F + lVar6));
            if (iVar3 == 0) {
              return -0x14;
            }
            lVar7 = lVar7 + 1;
            iVar3 = local_40->stages;
            __nmemb = (size_t)iVar3;
            lVar6 = lVar6 + 8;
          } while (lVar7 < (long)__nmemb);
        }
        lVar6 = __nmemb + local_38->liw;
        local_38->liw = lVar6;
        if (local_40->cvals == (realtype *)0x0) {
          prVar5 = (realtype *)calloc((long)(iVar3 + 1),8);
          local_40->cvals = prVar5;
          if (prVar5 == (realtype *)0x0) {
            return -0x14;
          }
          local_38->lrw = local_38->lrw + (long)(iVar3 + 1);
        }
        if (local_40->Xvecs == (N_Vector *)0x0) {
          pp_Var4 = (N_Vector *)calloc((long)(iVar3 + 1),8);
          local_40->Xvecs = pp_Var4;
          if (pp_Var4 == (N_Vector *)0x0) {
            return -0x14;
          }
          local_38->liw = lVar6 + (iVar3 + 1);
        }
        if ((local_38->interp == (ARKInterp)0x0) ||
           (iVar3 = arkInterpSetDegree(local_38,local_38->interp,1 - local_40->q), iVar3 == 0)) {
          local_38->call_fullrhs = 1;
          return 0;
        }
        msgfmt = "Unable to update interpolation polynomial degree";
      }
    }
    else {
      msgfmt = "Error in Butcher table";
    }
  }
  else {
    msgfmt = "Could not create Butcher table";
  }
  arkProcessError(local_38,-0x16,"ARKode::ERKStep","erkStep_Init",msgfmt);
  return -0x16;
}

Assistant:

int erkStep_Init(void* arkode_mem, int init_type)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval, j;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "erkStep_Init",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* immediately return if resize or reset */
  if (init_type == RESIZE_INIT || init_type == RESET_INIT)
    return(ARK_SUCCESS);

  /* enforce use of arkEwtSmallReal if using a fixed step size
     and an internal error weight function */
  if ( ark_mem->fixedstep && !ark_mem->user_efun ) {
    ark_mem->user_efun = SUNFALSE;
    ark_mem->efun      = arkEwtSetSmallReal;
    ark_mem->e_data    = ark_mem;
  }

  /* Create Butcher table (if not already set) */
  retval = erkStep_SetButcherTable(ark_mem);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep", "erkStep_Init",
                    "Could not create Butcher table");
    return(ARK_ILL_INPUT);
  }

  /* Check that Butcher table are OK */
  retval = erkStep_CheckButcherTable(ark_mem);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep",
                    "erkStep_Init", "Error in Butcher table");
    return(ARK_ILL_INPUT);
  }

  /* Retrieve/store method and embedding orders now that table is finalized */
  step_mem->q = ark_mem->hadapt_mem->q = step_mem->B->q;
  step_mem->p = ark_mem->hadapt_mem->p = step_mem->B->p;

  /* Ensure that if adaptivity is enabled, then method includes embedding coefficients */
  if (!ark_mem->fixedstep && (step_mem->p == 0)) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep", "erkStep_Init",
                    "Adaptive timestepping cannot be performed without embedding coefficients");
    return(ARK_ILL_INPUT);
  }

  /* Allocate ARK RHS vector memory, update storage requirements */
  /*   Allocate F[0] ... F[stages-1] if needed */
  if (step_mem->F == NULL)
    step_mem->F = (N_Vector *) calloc(step_mem->stages, sizeof(N_Vector));
  for (j=0; j<step_mem->stages; j++) {
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->F[j])))
      return(ARK_MEM_FAIL);
  }
  ark_mem->liw += step_mem->stages;  /* pointers */

  /* Allocate reusable arrays for fused vector interface */
  if (step_mem->cvals == NULL) {
    step_mem->cvals = (realtype *) calloc(step_mem->stages+1, sizeof(realtype));
    if (step_mem->cvals == NULL)  return(ARK_MEM_FAIL);
    ark_mem->lrw += (step_mem->stages + 1);
  }
  if (step_mem->Xvecs == NULL) {
    step_mem->Xvecs = (N_Vector *) calloc(step_mem->stages+1, sizeof(N_Vector));
    if (step_mem->Xvecs == NULL)  return(ARK_MEM_FAIL);
    ark_mem->liw += (step_mem->stages + 1);   /* pointers */
  }

  /* Limit interpolant degree based on method order (use negative
     argument to specify update instead of overwrite) */
  if (ark_mem->interp != NULL) {
    retval = arkInterpSetDegree(ark_mem, ark_mem->interp, -(step_mem->q-1));
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep", "erkStep_Init",
                      "Unable to update interpolation polynomial degree");
      return(ARK_ILL_INPUT);
    }
  }

  /* Signal to shared arkode module that fullrhs is required after each step */
  ark_mem->call_fullrhs = SUNTRUE;

  return(ARK_SUCCESS);
}